

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparatorDisposerTest.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_11def2::CaseInsensitiveComparator::~CaseInsensitiveComparator
          (CaseInsensitiveComparator *this)

{
  operator_delete(this,8);
  return;
}

Assistant:

bool contentsAreEquivalent(std::string receivedPath,
                                   std::string approvedPath) const override
        {
            std::ifstream receivedStream(receivedPath.c_str());
            std::ifstream approvedStream(approvedPath.c_str());

            using InputIter = std::istreambuf_iterator<char>;

            auto receivedText = std::string(InputIter{receivedStream}, InputIter{});
            auto approvedText = std::string(InputIter{approvedStream}, InputIter{});

            return StringUtils::toLower(receivedText) ==
                   StringUtils::toLower(approvedText);
        }